

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cc
# Opt level: O0

bool rcg::setString(shared_ptr<GenApi_3_4::CNodeMapRef> *nodemap,char *name,char *value,
                   bool exception)

{
  bool bVar1;
  int iVar2;
  undefined4 uVar3;
  _Ios_Openmode _Var4;
  uint uVar5;
  element_type *peVar6;
  undefined4 extraout_var;
  ulong uVar8;
  longlong lVar9;
  undefined8 uVar10;
  long lVar11;
  uchar *puVar12;
  unsigned_long *puVar13;
  invalid_argument *piVar14;
  byte in_CL;
  char *in_RDX;
  char *in_RSI;
  float fVar15;
  GenericException *ex;
  IString *p_5;
  size_t i_2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  size_t n;
  string s;
  IRegister *p_4;
  GenericException *anon_var_0;
  IEnumEntry *entry;
  IEnumeration *p_3;
  IFloat *p_2;
  int i_1;
  string elem_1;
  stringstream in_1;
  int64_t mac;
  int i;
  string elem;
  stringstream in;
  int64_t ip;
  IInteger *p_1;
  string v;
  IBoolean *p;
  INode *node;
  bool ret;
  size_t *in_stack_fffffffffffff588;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff590;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff598;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffff5a0;
  long *local_a28;
  long *local_9c0;
  long *local_980;
  long *local_950;
  long *local_8b8;
  long *local_880;
  allocator local_831;
  string local_830 [32];
  string local_810 [38];
  undefined1 local_7ea;
  allocator local_7e9;
  string local_7e8 [32];
  string local_7c8 [38];
  undefined1 local_7a2;
  allocator local_7a1;
  string local_7a0 [32];
  string local_780 [32];
  gcstring local_760 [80];
  long *local_710;
  unsigned_long local_708;
  size_type local_700;
  string local_6f8 [39];
  undefined1 local_6d1;
  ulong local_6d0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_6c8;
  undefined1 local_6aa;
  allocator local_6a9;
  string local_6a8 [96];
  string local_648 [32];
  long local_628;
  allocator local_619;
  string local_618 [32];
  long *local_5f8;
  undefined1 local_5ea;
  allocator local_5e9;
  string local_5e8 [96];
  string local_588 [40];
  gcstring local_560 [80];
  long *local_510;
  long *local_508;
  allocator local_4f9;
  string local_4f8 [32];
  long *local_4d8;
  allocator local_4c9;
  string local_4c8 [36];
  int local_4a4;
  string local_4a0 [39];
  allocator local_479;
  string local_478 [32];
  stringstream local_458 [392];
  ulong local_2d0;
  int local_2c4;
  string local_2c0 [39];
  allocator local_299;
  string local_298 [32];
  stringstream local_278 [392];
  ulong local_f0;
  allocator local_e1;
  string local_e0 [32];
  long *local_c0;
  allocator local_b1;
  string local_b0 [32];
  long *local_90;
  gcstring local_78 [80];
  long *local_28;
  byte local_1a;
  byte local_19;
  char *local_18;
  char *local_10;
  long *plVar7;
  
  local_19 = in_CL & 1;
  local_1a = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  peVar6 = std::
           __shared_ptr_access<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x12e83f);
  GenICam_3_4::gcstring::gcstring(local_78,local_10);
  iVar2 = (*(peVar6->super_CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>).
            super_CGeneric_XMLLoaderParams._vptr_CGeneric_XMLLoaderParams[7])(peVar6,local_78);
  plVar7 = (long *)CONCAT44(extraout_var,iVar2);
  GenICam_3_4::gcstring::~gcstring(local_78);
  local_28 = plVar7;
  if (plVar7 == (long *)0x0) {
    if ((local_19 & 1) != 0) {
      piVar14 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_830,"Feature not found: ",&local_831);
      std::operator+(in_stack_fffffffffffff598,(char *)in_stack_fffffffffffff590);
      std::invalid_argument::invalid_argument(piVar14,local_810);
      __cxa_throw(piVar14,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
  }
  else {
    bVar1 = GenApi_3_4::IsWritable((IBase *)in_stack_fffffffffffff590);
    if (bVar1) {
      uVar3 = (**(code **)(*local_28 + 0xf0))();
      switch(uVar3) {
      case 2:
        if (local_28 == (long *)0x0) {
          local_8b8 = (long *)0x0;
        }
        else {
          local_8b8 = (long *)__dynamic_cast(local_28,&GenApi_3_4::INode::typeinfo,
                                             &GenApi_3_4::IInteger::typeinfo,0xfffffffffffffffe);
        }
        local_c0 = local_8b8;
        iVar2 = (**(code **)(*local_8b8 + 0x88))();
        plVar7 = local_c0;
        if (iVar2 == 4) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_e0,local_18,&local_e1);
          lVar9 = std::__cxx11::stoll(in_stack_fffffffffffff590,in_stack_fffffffffffff588,0);
          (**(code **)(*plVar7 + 0x38))(plVar7,lVar9,1);
          std::__cxx11::string::~string(local_e0);
          std::allocator<char>::~allocator((allocator<char> *)&local_e1);
        }
        else if (iVar2 == 5) {
          local_f0 = 0;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_298,local_18,&local_299);
          _Var4 = std::operator|(_S_out,_S_in);
          std::__cxx11::stringstream::stringstream(local_278,local_298,_Var4);
          std::__cxx11::string::~string(local_298);
          std::allocator<char>::~allocator((allocator<char> *)&local_299);
          std::__cxx11::string::string(local_2c0);
          for (local_2c4 = 0; local_2c4 < 4; local_2c4 = local_2c4 + 1) {
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)local_278,local_2c0,'.');
            uVar8 = local_f0 << 8;
            uVar5 = std::__cxx11::stoi(in_stack_fffffffffffff590,in_stack_fffffffffffff588,0);
            local_f0 = uVar8 | (long)(int)(uVar5 & 0xff);
          }
          (**(code **)(*local_c0 + 0x38))(local_c0,local_f0,1);
          std::__cxx11::string::~string(local_2c0);
          std::__cxx11::stringstream::~stringstream(local_278);
        }
        else if (iVar2 == 6) {
          local_2d0 = 0;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_478,local_18,&local_479);
          _Var4 = std::operator|(_S_out,_S_in);
          std::__cxx11::stringstream::stringstream(local_458,local_478,_Var4);
          std::__cxx11::string::~string(local_478);
          std::allocator<char>::~allocator((allocator<char> *)&local_479);
          std::__cxx11::string::string(local_4a0);
          for (local_4a4 = 0; local_4a4 < 4; local_4a4 = local_4a4 + 1) {
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)local_458,local_4a0,':');
            uVar8 = local_2d0 << 8;
            uVar5 = std::__cxx11::stoi(in_stack_fffffffffffff590,in_stack_fffffffffffff588,0);
            local_2d0 = uVar8 | (long)(int)(uVar5 & 0xff);
          }
          (**(code **)(*local_c0 + 0x38))(local_c0,local_2d0,1);
          std::__cxx11::string::~string(local_4a0);
          std::__cxx11::stringstream::~stringstream(local_458);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_4c8,local_18,&local_4c9);
          lVar9 = std::__cxx11::stoll(in_stack_fffffffffffff590,in_stack_fffffffffffff588,0);
          (**(code **)(*plVar7 + 0x38))(plVar7,lVar9,1);
          std::__cxx11::string::~string(local_4c8);
          std::allocator<char>::~allocator((allocator<char> *)&local_4c9);
        }
        break;
      case 3:
        if (local_28 == (long *)0x0) {
          local_880 = (long *)0x0;
        }
        else {
          local_880 = (long *)__dynamic_cast(local_28,&GenApi_3_4::INode::typeinfo,
                                             &GenApi_3_4::IBoolean::typeinfo,0xfffffffffffffffe);
        }
        local_90 = local_880;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_b0,local_18,&local_b1);
        std::allocator<char>::~allocator((allocator<char> *)&local_b1);
        bVar1 = std::operator==(in_stack_fffffffffffff590,(char *)in_stack_fffffffffffff588);
        if (((bVar1) ||
            (bVar1 = std::operator==(in_stack_fffffffffffff590,(char *)in_stack_fffffffffffff588),
            bVar1)) ||
           (bVar1 = std::operator==(in_stack_fffffffffffff590,(char *)in_stack_fffffffffffff588),
           bVar1)) {
          (**(code **)(*local_90 + 0x38))(local_90,1);
        }
        else {
          bVar1 = std::operator==(in_stack_fffffffffffff590,(char *)in_stack_fffffffffffff588);
          if (((bVar1) ||
              (bVar1 = std::operator==(in_stack_fffffffffffff590,(char *)in_stack_fffffffffffff588),
              bVar1)) ||
             (bVar1 = std::operator==(in_stack_fffffffffffff590,(char *)in_stack_fffffffffffff588),
             plVar7 = local_90, bVar1)) {
            (**(code **)(*local_90 + 0x38))(local_90,0,1);
          }
          else {
            iVar2 = std::__cxx11::stoi(in_stack_fffffffffffff590,in_stack_fffffffffffff588,0);
            (**(code **)(*plVar7 + 0x38))(plVar7,iVar2 != 0,1,iVar2 != 0);
          }
        }
        std::__cxx11::string::~string(local_b0);
        break;
      default:
        if ((local_19 & 1) != 0) {
          local_7a2 = 1;
          piVar14 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_7a0,"Feature of unknown datatype: ",&local_7a1);
          std::operator+(in_stack_fffffffffffff598,(char *)in_stack_fffffffffffff590);
          std::invalid_argument::invalid_argument(piVar14,local_780);
          local_7a2 = 0;
          __cxa_throw(piVar14,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
        break;
      case 5:
        if (local_28 == (long *)0x0) {
          local_950 = (long *)0x0;
        }
        else {
          local_950 = (long *)__dynamic_cast(local_28,&GenApi_3_4::INode::typeinfo,
                                             &GenApi_3_4::IFloat::typeinfo,0xfffffffffffffffe);
        }
        local_4d8 = local_950;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_4f8,local_18,&local_4f9);
        fVar15 = std::__cxx11::stof(in_stack_fffffffffffff590,in_stack_fffffffffffff588);
        (**(code **)(*local_950 + 0x38))((double)fVar15,local_950,1);
        std::__cxx11::string::~string(local_4f8);
        std::allocator<char>::~allocator((allocator<char> *)&local_4f9);
        break;
      case 6:
        if (local_28 == (long *)0x0) {
          local_a28 = (long *)0x0;
        }
        else {
          local_a28 = (long *)__dynamic_cast(local_28,&GenApi_3_4::INode::typeinfo,
                                             &GenApi_3_4::IString::typeinfo,0xfffffffffffffffe);
        }
        local_710 = local_a28;
        GenICam_3_4::gcstring::gcstring(local_760,local_18);
        (**(code **)(*local_a28 + 0x38))(local_a28,local_760,1);
        GenICam_3_4::gcstring::~gcstring(local_760);
        break;
      case 7:
        if (local_28 == (long *)0x0) {
          local_9c0 = (long *)0x0;
        }
        else {
          local_9c0 = (long *)__dynamic_cast(local_28,&GenApi_3_4::INode::typeinfo,
                                             &GenApi_3_4::IRegister::typeinfo,0xfffffffffffffffe);
        }
        local_5f8 = local_9c0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_618,local_18,&local_619);
        std::allocator<char>::~allocator((allocator<char> *)&local_619);
        local_628 = std::__cxx11::string::find_first_not_of((char *)local_618,0x1446b0);
        if (local_628 != -1) {
          local_6aa = 1;
          piVar14 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_6a8,"Register \'",&local_6a9);
          std::operator+(in_stack_fffffffffffff598,(char *)in_stack_fffffffffffff590);
          std::operator+(in_stack_fffffffffffff598,(char *)in_stack_fffffffffffff590);
          std::operator+(in_stack_fffffffffffff598,in_stack_fffffffffffff590);
          std::invalid_argument::invalid_argument(piVar14,local_648);
          local_6aa = 0;
          __cxa_throw(piVar14,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x12fa79);
        for (local_6d0 = 0; uVar8 = local_6d0, lVar11 = std::__cxx11::string::size(),
            plVar7 = local_5f8, uVar8 < lVar11 - 1U; local_6d0 = local_6d0 + 2) {
          std::__cxx11::string::substr((ulong)local_6f8,(ulong)local_618);
          iVar2 = std::__cxx11::stoi(in_stack_fffffffffffff590,in_stack_fffffffffffff588,0);
          local_6d1 = (undefined1)iVar2;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffff590,(value_type_conflict *)in_stack_fffffffffffff588);
          std::__cxx11::string::~string(local_6f8);
        }
        puVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x12fba6);
        local_700 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_6c8);
        local_708 = (**(code **)(*local_5f8 + 0x48))(local_5f8,0);
        puVar13 = std::min<unsigned_long>(&local_700,&local_708);
        (**(code **)(*plVar7 + 0x38))(plVar7,puVar12,*puVar13,1);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  (in_stack_fffffffffffff5a0);
        std::__cxx11::string::~string(local_618);
        break;
      case 9:
        if (local_28 == (long *)0x0) {
          local_980 = (long *)0x0;
        }
        else {
          local_980 = (long *)__dynamic_cast(local_28,&GenApi_3_4::INode::typeinfo,
                                             &GenApi_3_4::IEnumeration::typeinfo,0xfffffffffffffffe)
          ;
        }
        local_508 = local_980;
        local_510 = (long *)0x0;
        GenICam_3_4::gcstring::gcstring(local_560,local_18);
        local_510 = (long *)(**(code **)(*local_980 + 0x68))(local_980,local_560);
        GenICam_3_4::gcstring::~gcstring(local_560);
        plVar7 = local_508;
        if (local_510 == (long *)0x0) {
          if ((local_19 & 1) != 0) {
            local_5ea = 1;
            piVar14 = (invalid_argument *)__cxa_allocate_exception(0x10);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_5e8,"Enumeration \'",&local_5e9);
            std::operator+(in_stack_fffffffffffff598,(char *)in_stack_fffffffffffff590);
            std::operator+(in_stack_fffffffffffff598,(char *)in_stack_fffffffffffff590);
            std::operator+(in_stack_fffffffffffff598,(char *)in_stack_fffffffffffff590);
            std::invalid_argument::invalid_argument(piVar14,local_588);
            local_5ea = 0;
            __cxa_throw(piVar14,&std::invalid_argument::typeinfo,
                        std::invalid_argument::~invalid_argument);
          }
        }
        else {
          uVar10 = (**(code **)(*local_510 + 0x38))();
          (**(code **)(*plVar7 + 0x50))(plVar7,uVar10,1);
        }
      }
    }
    else if ((local_19 & 1) != 0) {
      local_7ea = 1;
      piVar14 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_7e8,"Feature not writable: ",&local_7e9);
      std::operator+(in_stack_fffffffffffff598,(char *)in_stack_fffffffffffff590);
      std::invalid_argument::invalid_argument(piVar14,local_7c8);
      local_7ea = 0;
      __cxa_throw(piVar14,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
  }
  return (bool)(local_1a & 1);
}

Assistant:

bool setString(const std::shared_ptr<GenApi::CNodeMapRef> &nodemap, const char *name,
               const char *value, bool exception)
{
  bool ret=false;

  try
  {
    GenApi::INode *node=nodemap->_GetNode(name);

    if (node != 0)
    {
      if (GenApi::IsWritable(node))
      {
        switch (node->GetPrincipalInterfaceType())
        {
          case GenApi::intfIBoolean:
            {
              GenApi::IBoolean *p=dynamic_cast<GenApi::IBoolean *>(node);

              std::string v=std::string(value);
              if (v == "true" || v == "True" || v == "TRUE")
              {
                p->SetValue(1);
              }
              else if (v == "false" || v == "False" || v == "FALSE")
              {
                p->SetValue(0);
              }
              else
              {
                p->SetValue(static_cast<bool>(std::stoi(v)));
              }
            }
            break;

          case GenApi::intfIInteger:
            {
              GenApi::IInteger *p=dynamic_cast<GenApi::IInteger *>(node);

              switch (p->GetRepresentation())
              {
                case GenApi::HexNumber:
                  p->SetValue(std::stoll(std::string(value), 0, 16));
                  break;

                case GenApi::IPV4Address:
                  {
                    int64_t ip=0;

                    std::stringstream in(value);
                    std::string elem;

                    for (int i=0; i<4; i++)
                    {
                      getline(in, elem, '.');
                      ip=(ip<<8)|(stoi(elem)&0xff);
                    }

                    p->SetValue(ip);
                  }
                  break;

                case GenApi::MACAddress:
                  {
                    int64_t mac=0;

                    std::stringstream in(value);
                    std::string elem;

                    for (int i=0; i<4; i++)
                    {
                      getline(in, elem, ':');
                      mac=(mac<<8)|(stoi(elem, 0, 16)&0xff);
                    }

                    p->SetValue(mac);
                  }
                  break;

                default:
                  p->SetValue(std::stoll(std::string(value)));
                  break;
              }
            }
            break;

          case GenApi::intfIFloat:
            {
              GenApi::IFloat *p=dynamic_cast<GenApi::IFloat *>(node);
              p->SetValue(std::stof(std::string(value)));
            }
            break;

          case GenApi::intfIEnumeration:
            {
              GenApi::IEnumeration *p=dynamic_cast<GenApi::IEnumeration *>(node);
              GenApi::IEnumEntry *entry=0;

              try
              {
                entry=p->GetEntryByName(value);
              }
              catch (const GENICAM_NAMESPACE::GenericException &)
              { }

              if (entry != 0)
              {
                p->SetIntValue(entry->GetValue());
              }
              else if (exception)
              {
                throw std::invalid_argument(std::string("Enumeration '")+name+
                                            "' does not contain: "+value);
              }
            }
            break;

          case GenApi::intfIRegister:
            {
              GenApi::IRegister *p=dynamic_cast<GenApi::IRegister *>(node);

              std::string s=value;

              size_t n=s.find_first_not_of("0123456789abcdefABCDEF");
              if (n != std::string::npos)
              {
                throw std::invalid_argument(std::string("Register '")+name+
                  "only accepts hedadecimal values: "+s);
              }

              std::vector<uint8_t> buffer;
              for (size_t i=0; i<s.size()-1; i+=2)
              {
                buffer.push_back(stoi(s.substr(i, 2), 0, 16));
              }

              p->Set(buffer.data(), std::min(buffer.size(), static_cast<size_t>(p->GetLength())));
            }
            break;

          case GenApi::intfIString:
            {
              GenApi::IString *p=dynamic_cast<GenApi::IString *>(node);
              p->SetValue(value);
            }
            break;

          default:
            if (exception)
            {
              throw std::invalid_argument(std::string("Feature of unknown datatype: ")+name);
            }
            break;
        }
      }
      else if (exception)
      {
        throw std::invalid_argument(std::string("Feature not writable: ")+name);
      }
    }
    else if (exception)
    {
      throw std::invalid_argument(std::string("Feature not found: ")+name);
    }
  }
  catch (const GENICAM_NAMESPACE::GenericException &ex)
  {
    if (exception)
    {
      throw std::invalid_argument(ex.what());
    }
  }

  return ret;
}